

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O3

long __thiscall
gl4cts::anon_unknown_0::BasicMatrixOperationsBaseVS::Run(BasicMatrixOperationsBaseVS *this)

{
  CallLogWrapper *this_00;
  float fVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  GLuint GVar5;
  undefined4 extraout_var;
  pointer pcVar6;
  ulong uVar7;
  _Alloc_hider _Var8;
  long lVar9;
  vector<float,_std::allocator<float>_> out_data;
  vector<float,_std::allocator<float>_> expected;
  vector<float,_std::allocator<float>_> in;
  allocator<char> local_99;
  string local_98;
  void *local_78;
  long lStack_70;
  long local_68;
  void *local_58;
  long lStack_50;
  long local_48;
  string local_38;
  
  bVar2 = ShaderStorageBufferObjectBase::SupportedInVS(&this->super_ShaderStorageBufferObjectBase,2)
  ;
  lVar9 = 0x10;
  if (bVar2) {
    local_58 = (void *)0x0;
    lStack_50 = 0;
    local_48 = 0;
    local_68 = 0;
    local_78 = (void *)0x0;
    lStack_70 = 0;
    iVar4 = (*(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              _vptr_GLWrapper[9])(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,(char *)CONCAT44(extraout_var,iVar4),&local_99);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,0x1af8059);
    GVar5 = ShaderStorageBufferObjectBase::CreateProgram
                      (&this->super_ShaderStorageBufferObjectBase,&local_98,&local_38);
    this->m_program = GVar5;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
    bVar2 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program);
    lVar9 = -1;
    if (bVar2) {
      glu::CallLogWrapper::glGenBuffers(this_00,2,this->m_buffer);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)&local_98,lStack_70 - (long)local_78 >> 2,
                 (allocator_type *)&local_38);
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,1,this->m_buffer[1]);
      glu::CallLogWrapper::glBufferData
                (this_00,0x90d2,lStack_70 - (long)local_78,local_98._M_dataplus._M_p,0x88e4);
      if (local_98._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_98._M_dataplus._M_p,
                        local_98.field_2._M_allocated_capacity - (long)local_98._M_dataplus._M_p);
      }
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_buffer[0]);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,lStack_50 - (long)local_58,local_58,0x88e4);
      glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_vertex_array);
      glu::CallLogWrapper::glEnable(this_00,0x8c89);
      glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
      glu::CallLogWrapper::glDrawArrays(this_00,0,0,1);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)&local_98,lStack_70 - (long)local_78 >> 2,
                 (allocator_type *)&local_38);
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_buffer[1]);
      glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
      glu::CallLogWrapper::glGetBufferSubData
                (this_00,0x90d2,0,local_98._M_string_length - (long)local_98._M_dataplus._M_p,
                 local_98._M_dataplus._M_p);
      if ((pointer)local_98._M_string_length == local_98._M_dataplus._M_p) {
        uVar7 = 0;
      }
      else {
        bVar3 = 1;
        uVar7 = 0;
        pcVar6 = (pointer)local_98._M_string_length;
        _Var8._M_p = local_98._M_dataplus._M_p;
        do {
          fVar1 = *(float *)((long)local_78 + uVar7 * 4);
          if (0.001 <= ABS(fVar1 - *(float *)(_Var8._M_p + uVar7 * 4))) {
            anon_unknown_0::Output
                      ("Float at index %3d is %f should be %f.\n",
                       SUB84((double)*(float *)(_Var8._M_p + uVar7 * 4),0),(double)fVar1,
                       uVar7 & 0xffffffff);
            bVar3 = 0;
            pcVar6 = (pointer)local_98._M_string_length;
            _Var8._M_p = local_98._M_dataplus._M_p;
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 < (ulong)((long)pcVar6 - (long)_Var8._M_p >> 2));
        uVar7 = (ulong)(~bVar3 & 1);
        local_98._M_dataplus._M_p = _Var8._M_p;
      }
      if (local_98._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_98._M_dataplus._M_p,
                        local_98.field_2._M_allocated_capacity - (long)local_98._M_dataplus._M_p);
      }
      lVar9 = -uVar7;
    }
    if (local_78 != (void *)0x0) {
      operator_delete(local_78,local_68 - (long)local_78);
    }
    if (local_58 != (void *)0x0) {
      operator_delete(local_58,local_48 - (long)local_58);
    }
  }
  return lVar9;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(2))
			return NOT_SUPPORTED;
		std::vector<float> in;
		std::vector<float> expected;
		const char*		   glsl_vs = GetInput(in, expected);

		m_program = CreateProgram(glsl_vs, "");
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(2, m_buffer);

		/* output buffer */
		{
			std::vector<float> zero(expected.size());
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_buffer[1]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)(expected.size() * sizeof(float)), &zero[0],
						 GL_STATIC_DRAW);
		}
		// input buffer
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer[0]);
		glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)(in.size() * sizeof(float)), &in[0], GL_STATIC_DRAW);

		glGenVertexArrays(1, &m_vertex_array);
		glEnable(GL_RASTERIZER_DISCARD);

		glUseProgram(m_program);
		glBindVertexArray(m_vertex_array);
		glDrawArrays(GL_POINTS, 0, 1);

		std::vector<float> out_data(expected.size());
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_buffer[1]);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, (GLsizeiptr)(out_data.size() * sizeof(float)), &out_data[0]);

		bool status = true;
		for (size_t i = 0; i < out_data.size(); ++i)
		{
			if (!Equal(expected[i], out_data[i]))
			{
				Output("Float at index %3d is %f should be %f.\n", static_cast<int>(i), out_data[i], expected[i]);
				status = false;
			}
		}
		if (!status)
			return ERROR;
		return NO_ERROR;
	}